

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O3

bool __thiscall
iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription::
getConstraintsJacobianInfo
          (MultipleShootingTranscription *this,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *nonZeroElementRows,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *nonZeroElementColumns)

{
  bool bVar1;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  pointer puVar5;
  ulong uVar6;
  uint uVar7;
  
  bVar1 = this->m_prepared;
  if (bVar1 == false) {
    iDynTree::reportError
              ("MultipleShootingTranscription","getConstraintsInfo",
               "First you need to call the prepare method");
  }
  else {
    uVar6 = (long)(nonZeroElementRows->
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(nonZeroElementRows->
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    if (uVar6 != this->m_jacobianNonZeros) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (nonZeroElementRows,this->m_jacobianNonZeros & 0xffffffff);
      uVar6 = this->m_jacobianNonZeros;
    }
    if ((long)(nonZeroElementColumns->
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(nonZeroElementColumns->
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 != uVar6) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (nonZeroElementColumns,uVar6 & 0xffffffff);
      uVar6 = this->m_jacobianNonZeros;
    }
    if (uVar6 != 0) {
      puVar2 = (this->m_jacobianNZRows).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar3 = (this->m_jacobianNZCols).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar4 = (nonZeroElementRows->
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar5 = (nonZeroElementColumns->
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar7 = 1;
      uVar6 = 0;
      do {
        puVar4[uVar6] = puVar2[uVar6];
        puVar5[uVar6] = puVar3[uVar6];
        uVar6 = (ulong)uVar7;
        uVar7 = uVar7 + 1;
      } while (uVar6 < this->m_jacobianNonZeros);
    }
  }
  return bVar1;
}

Assistant:

virtual bool getConstraintsJacobianInfo(std::vector<size_t>& nonZeroElementRows, std::vector<size_t>& nonZeroElementColumns) override {

                if (!(m_prepared)){
                    reportError("MultipleShootingTranscription", "getConstraintsInfo", "First you need to call the prepare method");
                    return false;
                }

                if (nonZeroElementRows.size() != m_jacobianNonZeros) {
                    nonZeroElementRows.resize(static_cast<unsigned int>(m_jacobianNonZeros));
                }

                if (nonZeroElementColumns.size() != m_jacobianNonZeros) {
                    nonZeroElementColumns.resize(static_cast<unsigned int>(m_jacobianNonZeros));
                }


                for (unsigned int i = 0; i < m_jacobianNonZeros; ++i){ //not the full vector of nonZeros should be read
                    nonZeroElementRows[i] = m_jacobianNZRows[i];
                    nonZeroElementColumns[i] = m_jacobianNZCols[i];
                }

                return true;
            }